

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall ViewTest::scalarConstructorTest<false>(ViewTest *this)

{
  logic_error *this_00;
  code *pcVar1;
  undefined *puVar2;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  View<int,_false,_std::allocator<unsigned_long>_> local_50;
  
  local_50.data_ = &this->scalar_;
  local_50.geometry_.shape_ = (size_t *)operator_new(0);
  local_50.geometry_.dimension_ = 0;
  local_50.geometry_.size_ = 1;
  local_50.geometry_.coordinateOrder_ = LastMajorOrder;
  local_50.geometry_.isSimple_ = true;
  local_50.geometry_.shapeStrides_ = local_50.geometry_.shape_;
  local_50.geometry_.strides_ = local_50.geometry_.shape_;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_50);
  if (local_50.geometry_.size_ == 1) {
    if ((ViewTest *)local_50.data_ == (ViewTest *)0x0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)this_00,"Assertion failed.");
      pcVar1 = std::runtime_error::~runtime_error;
      puVar2 = &std::runtime_error::typeinfo;
      goto LAB_0014fa62;
    }
    if (local_50.geometry_.dimension_ == 0) {
      operator_delete(local_50.geometry_.shape_,0);
      return;
    }
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"test failed.");
  pcVar1 = std::logic_error::~logic_error;
  puVar2 = &std::logic_error::typeinfo;
LAB_0014fa62:
  __cxa_throw(this_00,puVar2,pcVar1);
}

Assistant:

void ViewTest::scalarConstructorTest() {
    andres::View<int, constTarget> v(&scalar_); 
    
    test(v.size() == 1 &&
           v.dimension() == 0);
}